

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void finish(gdmf *d)

{
  v_array<float>::delete_v(&d->scalars);
  return;
}

Assistant:

void finish(gdmf& d) { d.scalars.delete_v(); }